

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UpsampleLayerParams::MergeFrom
          (UpsampleLayerParams *this,UpsampleLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x902c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&this->scalingfactor_,&from->scalingfactor_);
  google::protobuf::RepeatedField<float>::MergeFrom
            (&this->fractionalscalingfactor_,&from->fractionalscalingfactor_);
  if (from->mode_ != 0) {
    this->mode_ = from->mode_;
  }
  if (from->linearupsamplemode_ != 0) {
    this->linearupsamplemode_ = from->linearupsamplemode_;
  }
  return;
}

Assistant:

void UpsampleLayerParams::MergeFrom(const UpsampleLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.UpsampleLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  scalingfactor_.MergeFrom(from.scalingfactor_);
  fractionalscalingfactor_.MergeFrom(from.fractionalscalingfactor_);
  if (from.mode() != 0) {
    set_mode(from.mode());
  }
  if (from.linearupsamplemode() != 0) {
    set_linearupsamplemode(from.linearupsamplemode());
  }
}